

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

ssize_t test_bson_json_read_cb_helper(void *string,uint8_t *buf,size_t len)

{
  size_t sVar1;
  
  sVar1 = strlen((char *)string);
  if (sVar1 != 0) {
    if (sVar1 < len) {
      len = sVar1;
    }
    memcpy(buf,string,len);
  }
  return sVar1;
}

Assistant:

static ssize_t
test_bson_json_read_cb_helper (void *string, uint8_t *buf, size_t len)
{
   size_t str_size = strlen ((char *) string);
   if (str_size) {
      memcpy (buf, string, BSON_MIN (str_size, len));
      return str_size;
   } else {
      return 0;
   }
}